

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

string * __thiscall
cmState::Snapshot::GetEntryPointCommand_abi_cxx11_(string *__return_storage_ptr__,Snapshot *this)

{
  pointer pcVar1;
  PointerType pSVar2;
  
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pSVar2->EntryPointCommand)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (pSVar2->EntryPointCommand)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string cmState::Snapshot::GetEntryPointCommand() const
{
  return this->Position->EntryPointCommand;
}